

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  uint uVar10;
  undefined8 uVar11;
  char cVar12;
  uint uVar13;
  long *plVar14;
  size_t sVar15;
  long *plVar16;
  byte bVar17;
  long *plVar18;
  long lVar19;
  long *plVar20;
  long *plVar21;
  uint uVar22;
  long *plVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  BYTE *pBVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  U32 UVar32;
  ulong uVar33;
  seqDef *psVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  U32 UVar38;
  long *plVar39;
  long *plVar40;
  uint local_c4;
  BYTE *litLimit_w_3;
  long *local_b0;
  BYTE *litLimit_w;
  ulong local_68;
  ulong local_58;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1ab,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar22 = (ms->cParams).minMatch;
  uVar13 = (ms->cParams).targetLength;
  pUVar8 = ms->hashTable;
  uVar6 = (ms->cParams).hashLog;
  cVar12 = (char)uVar6;
  local_b0 = (long *)src;
  if (uVar13 < 2) {
    pBVar9 = (ms->window).base;
    plVar1 = (long *)((long)src + srcSize);
    iVar35 = (int)pBVar9;
    iVar30 = (int)plVar1 - iVar35;
    uVar25 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar13 = (ms->window).dictLimit;
    uVar7 = iVar30 - uVar25;
    if (iVar30 - uVar13 <= uVar25) {
      uVar7 = uVar13;
    }
    if (ms->loadedDictEnd != 0) {
      uVar7 = uVar13;
    }
    pBVar2 = pBVar9 + uVar7;
    plVar23 = (long *)((ulong)(pBVar2 == (BYTE *)src) + (long)src);
    iVar30 = (int)plVar23 - iVar35;
    uVar24 = iVar30 - uVar25;
    if (iVar30 - uVar13 <= uVar25) {
      uVar24 = uVar13;
    }
    uVar25 = *rep;
    uVar31 = rep[1];
    if (ms->loadedDictEnd != 0) {
      uVar24 = uVar13;
    }
    uVar24 = iVar30 - uVar24;
    local_c4 = uVar31;
    if (uVar24 < uVar31) {
      local_c4 = 0;
    }
    uVar13 = 0;
    if (uVar25 <= uVar24) {
      uVar13 = uVar25;
    }
    local_68 = (ulong)uVar13;
    plVar4 = (long *)((long)src + (srcSize - 8));
    if (uVar22 == 5) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        uVar22 = (uint)local_68;
        if (plVar4 <= (long *)((long)plVar23 + 3U)) break;
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar39 = plVar23 + 0x10;
        uVar36 = (ulong)(*plVar23 * -0x30e4432345000000) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar36];
        lVar29 = -local_68;
        plVar21 = (long *)((long)plVar23 + 2);
        plVar20 = (long *)((long)plVar23 + 1);
        uVar37 = 2;
        plVar18 = (long *)((long)plVar23 + 3U);
        while( true ) {
          plVar16 = plVar21;
          uVar28 = (ulong)(lVar19 * -0x30e4432345000000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar36] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar37 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar37);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar37));
            uVar37 = uVar37 | 4;
            pUVar8[uVar28] = (int)plVar20 - iVar35;
            UVar32 = 1;
            uVar22 = local_c4;
            goto LAB_001b95cc;
          }
          if ((uVar7 <= uVar13) &&
             (uVar33 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar33)))
          goto LAB_001b957c;
          uVar13 = pUVar8[uVar28];
          uVar33 = (ulong)uVar13;
          uVar36 = (ulong)(*plVar16 * -0x30e4432345000000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar20 - iVar35;
          pUVar8[uVar28] = UVar38;
          if ((uVar7 <= uVar13) && ((int)*plVar20 == *(int *)(pBVar9 + uVar33))) break;
          uVar13 = pUVar8[uVar36];
          uVar28 = uVar37;
          if (plVar39 <= (long *)((long)plVar16 + uVar37)) {
            plVar39 = plVar39 + 0x10;
            uVar28 = uVar37 + 1;
          }
          lVar19 = *plVar18;
          plVar40 = (long *)(uVar37 + (long)plVar18);
          plVar21 = (long *)((long)plVar16 + uVar37);
          plVar20 = plVar18;
          plVar23 = plVar16;
          uVar37 = uVar28;
          plVar18 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001ba3bd;
        }
        plVar23 = plVar20;
        plVar20 = plVar16;
        uVar28 = uVar36;
        if (uVar37 < 5) {
LAB_001b957c:
          pUVar8[uVar28] = (int)plVar20 - iVar35;
        }
        pBVar27 = pBVar9 + uVar33;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_68 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar37 = 4;
        for (; ((pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar37 = uVar37 + 1;
        }
LAB_001b95cc:
        sVar15 = ZSTD_count((BYTE *)(uVar37 + (long)plVar23),pBVar27 + uVar37,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar36 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar36))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b965a:
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar36) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar36) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar36);
              }
              goto LAB_001b965a;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar36;
        }
        uVar37 = sVar15 + uVar37;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar36;
        psVar34->offBase = UVar32;
        if (uVar37 < 3) goto LAB_001ba419;
        if (0xffff < uVar37 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar37 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar37);
        local_b0 = plVar23;
        local_c4 = uVar22;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e4432345000000) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          local_c4 = 0;
          if (uVar22 != 0) {
            for (; (local_b0 = plVar23, local_c4 = uVar22, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)uVar22)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)uVar22)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar37 = (ulong)uVar22;
              uVar22 = (uint)local_68;
              local_68 = uVar37;
            }
          }
        }
      }
    }
    else if (uVar22 == 6) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        uVar22 = (uint)local_68;
        if (plVar4 <= (long *)((long)plVar23 + 3U)) break;
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar39 = plVar23 + 0x10;
        uVar36 = (ulong)(*plVar23 * -0x30e4432340650000) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar36];
        lVar29 = -local_68;
        plVar21 = (long *)((long)plVar23 + 2);
        plVar20 = (long *)((long)plVar23 + 1);
        uVar37 = 2;
        plVar18 = (long *)((long)plVar23 + 3U);
        while( true ) {
          plVar16 = plVar21;
          uVar28 = (ulong)(lVar19 * -0x30e4432340650000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar36] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar37 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar37);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar37));
            uVar37 = uVar37 | 4;
            pUVar8[uVar28] = (int)plVar20 - iVar35;
            UVar32 = 1;
            uVar22 = local_c4;
            goto LAB_001b8b5d;
          }
          if ((uVar7 <= uVar13) &&
             (uVar33 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar33)))
          goto LAB_001b8b0d;
          uVar13 = pUVar8[uVar28];
          uVar33 = (ulong)uVar13;
          uVar36 = (ulong)(*plVar16 * -0x30e4432340650000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar20 - iVar35;
          pUVar8[uVar28] = UVar38;
          if ((uVar7 <= uVar13) && ((int)*plVar20 == *(int *)(pBVar9 + uVar33))) break;
          uVar13 = pUVar8[uVar36];
          uVar28 = uVar37;
          if (plVar39 <= (long *)((long)plVar16 + uVar37)) {
            plVar39 = plVar39 + 0x10;
            uVar28 = uVar37 + 1;
          }
          lVar19 = *plVar18;
          plVar40 = (long *)(uVar37 + (long)plVar18);
          plVar21 = (long *)((long)plVar16 + uVar37);
          plVar20 = plVar18;
          plVar23 = plVar16;
          uVar37 = uVar28;
          plVar18 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001ba3bd;
        }
        plVar23 = plVar20;
        plVar20 = plVar16;
        uVar28 = uVar36;
        if (uVar37 < 5) {
LAB_001b8b0d:
          pUVar8[uVar28] = (int)plVar20 - iVar35;
        }
        pBVar27 = pBVar9 + uVar33;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_68 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar37 = 4;
        for (; ((pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar37 = uVar37 + 1;
        }
LAB_001b8b5d:
        sVar15 = ZSTD_count((BYTE *)(uVar37 + (long)plVar23),pBVar27 + uVar37,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar36 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar36))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b8beb:
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar36) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar36) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar36);
              }
              goto LAB_001b8beb;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar36;
        }
        uVar37 = sVar15 + uVar37;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar36;
        psVar34->offBase = UVar32;
        if (uVar37 < 3) goto LAB_001ba419;
        if (0xffff < uVar37 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar37 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar37);
        local_b0 = plVar23;
        local_c4 = uVar22;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e4432340650000) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          local_c4 = 0;
          if (uVar22 != 0) {
            for (; (local_b0 = plVar23, local_c4 = uVar22, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)uVar22)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)uVar22)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar37 = (ulong)uVar22;
              uVar22 = (uint)local_68;
              local_68 = uVar37;
            }
          }
        }
      }
    }
    else if (uVar22 == 7) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        uVar22 = (uint)local_68;
        if (plVar4 <= (long *)((long)plVar23 + 3U)) break;
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar39 = plVar23 + 0x10;
        uVar36 = (ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar36];
        lVar29 = -local_68;
        plVar21 = (long *)((long)plVar23 + 2);
        plVar20 = (long *)((long)plVar23 + 1);
        uVar37 = 2;
        plVar18 = (long *)((long)plVar23 + 3U);
        while( true ) {
          plVar16 = plVar21;
          uVar28 = (ulong)(lVar19 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar36] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar37 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar37);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar37));
            uVar37 = uVar37 | 4;
            pUVar8[uVar28] = (int)plVar20 - iVar35;
            UVar32 = 1;
            uVar22 = local_c4;
            goto LAB_001b8119;
          }
          if ((uVar7 <= uVar13) &&
             (uVar33 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar33)))
          goto LAB_001b80c9;
          uVar13 = pUVar8[uVar28];
          uVar33 = (ulong)uVar13;
          uVar36 = (ulong)(*plVar16 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar20 - iVar35;
          pUVar8[uVar28] = UVar38;
          if ((uVar7 <= uVar13) && ((int)*plVar20 == *(int *)(pBVar9 + uVar33))) break;
          uVar13 = pUVar8[uVar36];
          uVar28 = uVar37;
          if (plVar39 <= (long *)((long)plVar16 + uVar37)) {
            plVar39 = plVar39 + 0x10;
            uVar28 = uVar37 + 1;
          }
          lVar19 = *plVar18;
          plVar40 = (long *)(uVar37 + (long)plVar18);
          plVar21 = (long *)((long)plVar16 + uVar37);
          plVar20 = plVar18;
          plVar23 = plVar16;
          uVar37 = uVar28;
          plVar18 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001ba3bd;
        }
        plVar23 = plVar20;
        plVar20 = plVar16;
        uVar28 = uVar36;
        if (uVar37 < 5) {
LAB_001b80c9:
          pUVar8[uVar28] = (int)plVar20 - iVar35;
        }
        pBVar27 = pBVar9 + uVar33;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_68 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar37 = 4;
        for (; ((pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar37 = uVar37 + 1;
        }
LAB_001b8119:
        sVar15 = ZSTD_count((BYTE *)(uVar37 + (long)plVar23),pBVar27 + uVar37,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar36 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar36))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b81a7:
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar36) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar36) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar36);
              }
              goto LAB_001b81a7;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar36;
        }
        uVar37 = sVar15 + uVar37;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar36;
        psVar34->offBase = UVar32;
        if (uVar37 < 3) goto LAB_001ba419;
        if (0xffff < uVar37 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar37 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar37);
        local_b0 = plVar23;
        local_c4 = uVar22;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e44323405a9d00) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          local_c4 = 0;
          if (uVar22 != 0) {
            for (; (local_b0 = plVar23, local_c4 = uVar22, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)uVar22)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)uVar22)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar37 = (ulong)uVar22;
              uVar22 = (uint)local_68;
              local_68 = uVar37;
            }
          }
        }
      }
    }
    else {
      bVar17 = 0x20 - cVar12;
      plVar14 = plVar1 + -4;
LAB_001b9eab:
      uVar22 = (uint)local_68;
      if ((long *)((long)plVar23 + 3U) < plVar4) {
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar39 = plVar23 + 0x10;
        uVar36 = (ulong)((uint)((int)*plVar23 * -0x61c8864f) >> (bVar17 & 0x1f));
        iVar30 = *(int *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar36];
        lVar19 = -local_68;
        uVar37 = 2;
        plVar21 = (long *)((long)plVar23 + 1);
        plVar20 = (long *)((long)plVar23 + 3U);
        plVar18 = (long *)((long)plVar23 + 2);
        while( true ) {
          uVar28 = (ulong)((uint)(iVar30 * -0x61c8864f) >> (bVar17 & 0x1f));
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar18 + lVar19);
          pUVar8[uVar36] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar18 == iVar30)) {
            uVar37 = (ulong)(*(char *)((long)plVar18 - 1) == *(char *)((long)plVar18 + lVar19 + -1))
            ;
            plVar23 = (long *)((long)plVar18 - uVar37);
            pBVar27 = (BYTE *)((long)plVar18 + (lVar19 - uVar37));
            uVar37 = uVar37 | 4;
            pUVar8[uVar28] = (int)plVar21 - iVar35;
            UVar32 = 1;
            uVar22 = local_c4;
            goto LAB_001ba07e;
          }
          if ((uVar7 <= uVar13) &&
             (uVar33 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar33)))
          goto LAB_001ba032;
          uVar13 = pUVar8[uVar28];
          uVar33 = (ulong)uVar13;
          uVar36 = (ulong)((uint)((int)*plVar18 * -0x61c8864f) >> (bVar17 & 0x1f));
          UVar38 = (int)plVar21 - iVar35;
          pUVar8[uVar28] = UVar38;
          if ((uVar7 <= uVar13) && ((int)*plVar21 == *(int *)(pBVar9 + uVar33))) break;
          uVar13 = pUVar8[uVar36];
          plVar16 = (long *)((long)plVar18 + uVar37);
          uVar28 = uVar37;
          if (plVar39 <= plVar16) {
            plVar39 = plVar39 + 0x10;
            uVar28 = uVar37 + 1;
          }
          iVar30 = (int)*plVar20;
          plVar40 = (long *)(uVar37 + (long)plVar20);
          uVar37 = uVar28;
          plVar21 = plVar20;
          plVar23 = plVar18;
          plVar20 = plVar40;
          plVar18 = plVar16;
          if (plVar4 <= plVar40) goto LAB_001ba3bd;
        }
        plVar23 = plVar21;
        plVar21 = plVar18;
        uVar28 = uVar36;
        if (uVar37 < 5) {
LAB_001ba032:
          pUVar8[uVar28] = (int)plVar21 - iVar35;
        }
        pBVar27 = pBVar9 + uVar33;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_68 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar37 = 4;
        for (; ((pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar37 = uVar37 + 1;
        }
LAB_001ba07e:
        sVar15 = ZSTD_count((BYTE *)(uVar37 + (long)plVar23),pBVar27 + uVar37,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar36 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar36))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001ba10c:
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar36) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar36) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar36);
              }
              goto LAB_001ba10c;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar36;
        }
        uVar37 = sVar15 + uVar37;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar36;
        psVar34->offBase = UVar32;
        if (uVar37 < 3) goto LAB_001ba419;
        if (0xffff < uVar37 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar37 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar37);
        local_b0 = plVar23;
        local_c4 = uVar22;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(uint)(*(int *)(pBVar9 + (ulong)UVar38 + 2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               UVar38 + 2;
          pUVar8[(uint)(*(int *)((long)plVar23 + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)plVar23 + -2) - iVar35;
          local_c4 = 0;
          if (uVar22 != 0) {
            for (; local_b0 = plVar23, local_c4 = uVar22, plVar23 <= plVar4;
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              lVar19 = *plVar23;
              if ((int)lVar19 != *(int *)((long)plVar23 - (ulong)uVar22)) break;
              uVar37 = (ulong)uVar22;
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)uVar22)),(BYTE *)plVar1);
              pUVar8[(uint)((int)lVar19 * -0x61c8864f) >> (bVar17 & 0x1f)] = (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar22 = (uint)local_68;
              local_68 = uVar37;
            }
          }
        }
        goto LAB_001b9eab;
      }
    }
LAB_001ba3bd:
    if (uVar31 <= uVar24) {
      uVar31 = 0;
    }
    uVar13 = uVar31;
    if (uVar22 != 0) {
      uVar13 = uVar25;
    }
    if (uVar25 <= uVar24) {
      uVar13 = uVar31;
      uVar25 = 0;
    }
    if (uVar22 != 0) {
      uVar25 = uVar22;
    }
    *rep = uVar25;
  }
  else {
    pBVar9 = (ms->window).base;
    plVar1 = (long *)((long)src + srcSize);
    iVar35 = (int)pBVar9;
    iVar30 = (int)plVar1 - iVar35;
    uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar7 = (ms->window).dictLimit;
    uVar25 = iVar30 - uVar24;
    if (iVar30 - uVar7 <= uVar24) {
      uVar25 = uVar7;
    }
    if (ms->loadedDictEnd != 0) {
      uVar25 = uVar7;
    }
    pBVar2 = pBVar9 + uVar25;
    plVar23 = (long *)((ulong)(pBVar2 == (BYTE *)src) + (long)src);
    iVar30 = (int)plVar23 - iVar35;
    uVar31 = iVar30 - uVar24;
    if (iVar30 - uVar7 <= uVar24) {
      uVar31 = uVar7;
    }
    if (ms->loadedDictEnd != 0) {
      uVar31 = uVar7;
    }
    uVar37 = (ulong)(uVar13 + 1);
    uVar7 = *rep;
    uVar24 = rep[1];
    uVar31 = iVar30 - uVar31;
    uVar13 = uVar24;
    if (uVar31 < uVar24) {
      uVar13 = 0;
    }
    uVar10 = 0;
    if (uVar7 <= uVar31) {
      uVar10 = uVar7;
    }
    local_58 = (ulong)uVar10;
    plVar4 = (long *)((long)src + (srcSize - 8));
    if (uVar22 == 5) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        local_c4 = uVar13;
        uVar22 = (uint)local_58;
        plVar39 = (long *)((long)plVar23 + uVar37 + 1);
        if (plVar4 <= plVar39) break;
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar21 = plVar23 + 0x10;
        uVar28 = (ulong)(*plVar23 * -0x30e4432345000000) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar28];
        lVar29 = -local_58;
        plVar20 = (long *)(uVar37 + (long)plVar23);
        plVar18 = (long *)((long)plVar23 + 1);
        uVar36 = uVar37;
        while( true ) {
          plVar16 = plVar20;
          uVar33 = (ulong)(lVar19 * -0x30e4432345000000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar28] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar36 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar36);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar8[uVar33] = (int)plVar18 - iVar35;
            UVar32 = 1;
            goto LAB_001b9094;
          }
          if ((uVar25 <= uVar13) &&
             (uVar26 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar26)))
          goto LAB_001b9044;
          uVar13 = pUVar8[uVar33];
          uVar26 = (ulong)uVar13;
          uVar28 = (ulong)(*plVar16 * -0x30e4432345000000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar18 - iVar35;
          pUVar8[uVar33] = UVar38;
          if ((uVar25 <= uVar13) && ((int)*plVar18 == *(int *)(pBVar9 + uVar26))) break;
          uVar13 = pUVar8[uVar28];
          uVar33 = uVar36;
          if (plVar21 <= (long *)((long)plVar16 + uVar36)) {
            plVar21 = plVar21 + 0x10;
            uVar33 = uVar36 + 1;
          }
          lVar19 = *plVar39;
          plVar40 = (long *)(uVar36 + (long)plVar39);
          plVar20 = (long *)((long)plVar16 + uVar36);
          plVar18 = plVar39;
          plVar23 = plVar16;
          uVar36 = uVar33;
          plVar39 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001b9e51;
        }
        plVar23 = plVar18;
        plVar18 = plVar16;
        uVar33 = uVar28;
        if (uVar36 < 5) {
LAB_001b9044:
          pUVar8[uVar33] = (int)plVar18 - iVar35;
        }
        pBVar27 = pBVar9 + uVar26;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_58 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar36 = 4;
        for (; ((local_c4 = uVar22, pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_001b9094:
        sVar15 = ZSTD_count((BYTE *)(uVar36 + (long)plVar23),pBVar27 + uVar36,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar28 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar28))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b9122:
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar28) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar28) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar28);
              }
              goto LAB_001b9122;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar28;
        }
        uVar36 = sVar15 + uVar36;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar28;
        psVar34->offBase = UVar32;
        if (uVar36 < 3) goto LAB_001ba419;
        if (0xffff < uVar36 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar36 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar36);
        local_b0 = plVar23;
        uVar13 = local_c4;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e4432345000000) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          uVar13 = 0;
          if (local_c4 != 0) {
            for (; (local_b0 = plVar23, uVar13 = local_c4, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)local_c4)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar36 = (ulong)local_c4;
              local_c4 = (uint)local_58;
              local_58 = uVar36;
            }
          }
        }
      }
    }
    else if (uVar22 == 6) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        local_c4 = uVar13;
        uVar22 = (uint)local_58;
        plVar39 = (long *)((long)plVar23 + uVar37 + 1);
        if (plVar4 <= plVar39) break;
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar21 = plVar23 + 0x10;
        uVar28 = (ulong)(*plVar23 * -0x30e4432340650000) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar28];
        lVar29 = -local_58;
        plVar20 = (long *)(uVar37 + (long)plVar23);
        plVar18 = (long *)((long)plVar23 + 1);
        uVar36 = uVar37;
        while( true ) {
          plVar16 = plVar20;
          uVar33 = (ulong)(lVar19 * -0x30e4432340650000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar28] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar36 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar36);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar8[uVar33] = (int)plVar18 - iVar35;
            UVar32 = 1;
            goto LAB_001b8641;
          }
          if ((uVar25 <= uVar13) &&
             (uVar26 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar26)))
          goto LAB_001b85f1;
          uVar13 = pUVar8[uVar33];
          uVar26 = (ulong)uVar13;
          uVar28 = (ulong)(*plVar16 * -0x30e4432340650000) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar18 - iVar35;
          pUVar8[uVar33] = UVar38;
          if ((uVar25 <= uVar13) && ((int)*plVar18 == *(int *)(pBVar9 + uVar26))) break;
          uVar13 = pUVar8[uVar28];
          uVar33 = uVar36;
          if (plVar21 <= (long *)((long)plVar16 + uVar36)) {
            plVar21 = plVar21 + 0x10;
            uVar33 = uVar36 + 1;
          }
          lVar19 = *plVar39;
          plVar40 = (long *)(uVar36 + (long)plVar39);
          plVar20 = (long *)((long)plVar16 + uVar36);
          plVar18 = plVar39;
          plVar23 = plVar16;
          uVar36 = uVar33;
          plVar39 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001b9e51;
        }
        plVar23 = plVar18;
        plVar18 = plVar16;
        uVar33 = uVar28;
        if (uVar36 < 5) {
LAB_001b85f1:
          pUVar8[uVar33] = (int)plVar18 - iVar35;
        }
        pBVar27 = pBVar9 + uVar26;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_58 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar36 = 4;
        for (; ((local_c4 = uVar22, pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_001b8641:
        sVar15 = ZSTD_count((BYTE *)(uVar36 + (long)plVar23),pBVar27 + uVar36,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar28 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar28))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b86cf:
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar28) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar28) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar28);
              }
              goto LAB_001b86cf;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar28;
        }
        uVar36 = sVar15 + uVar36;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar28;
        psVar34->offBase = UVar32;
        if (uVar36 < 3) goto LAB_001ba419;
        if (0xffff < uVar36 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar36 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar36);
        local_b0 = plVar23;
        uVar13 = local_c4;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e4432340650000) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          uVar13 = 0;
          if (local_c4 != 0) {
            for (; (local_b0 = plVar23, uVar13 = local_c4, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)local_c4)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar36 = (ulong)local_c4;
              local_c4 = (uint)local_58;
              local_58 = uVar36;
            }
          }
        }
      }
    }
    else if (uVar22 == 7) {
      bVar17 = 0x40 - cVar12;
      plVar14 = plVar1 + -4;
      while( true ) {
        local_c4 = uVar13;
        uVar22 = (uint)local_58;
        plVar39 = (long *)((long)plVar23 + uVar37 + 1);
        if (plVar4 <= plVar39) break;
        if (0x20 < uVar6) {
LAB_001ba4d3:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        plVar21 = plVar23 + 0x10;
        uVar28 = (ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        lVar19 = *(long *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar28];
        lVar29 = -local_58;
        plVar20 = (long *)(uVar37 + (long)plVar23);
        plVar18 = (long *)((long)plVar23 + 1);
        uVar36 = uVar37;
        while( true ) {
          plVar16 = plVar20;
          uVar33 = (ulong)(lVar19 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar16 + lVar29);
          pUVar8[uVar28] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar16 == iVar30)) {
            uVar36 = (ulong)(*(char *)((long)plVar16 - 1) == *(char *)((long)plVar16 + lVar29 + -1))
            ;
            plVar23 = (long *)((long)plVar16 - uVar36);
            pBVar27 = (BYTE *)((long)plVar16 + (lVar29 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar8[uVar33] = (int)plVar18 - iVar35;
            UVar32 = 1;
            goto LAB_001b7b2b;
          }
          if ((uVar25 <= uVar13) &&
             (uVar26 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar26)))
          goto LAB_001b7adb;
          uVar13 = pUVar8[uVar33];
          uVar26 = (ulong)uVar13;
          uVar28 = (ulong)(*plVar16 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
          UVar38 = (int)plVar18 - iVar35;
          pUVar8[uVar33] = UVar38;
          if ((uVar25 <= uVar13) && ((int)*plVar18 == *(int *)(pBVar9 + uVar26))) break;
          uVar13 = pUVar8[uVar28];
          uVar33 = uVar36;
          if (plVar21 <= (long *)((long)plVar16 + uVar36)) {
            plVar21 = plVar21 + 0x10;
            uVar33 = uVar36 + 1;
          }
          lVar19 = *plVar39;
          plVar40 = (long *)(uVar36 + (long)plVar39);
          plVar20 = (long *)((long)plVar16 + uVar36);
          plVar18 = plVar39;
          plVar23 = plVar16;
          uVar36 = uVar33;
          plVar39 = plVar40;
          if (plVar4 <= plVar40) goto LAB_001b9e51;
        }
        plVar23 = plVar18;
        plVar18 = plVar16;
        uVar33 = uVar28;
        if (uVar36 < 5) {
LAB_001b7adb:
          pUVar8[uVar33] = (int)plVar18 - iVar35;
        }
        pBVar27 = pBVar9 + uVar26;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_58 = (ulong)uVar13;
        if (uVar13 == 0) {
LAB_001ba530:
          __assert_fail("(rep_offset1)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                        ,0x16a,
                        "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        UVar32 = uVar13 + 3;
        uVar36 = 4;
        for (; ((local_c4 = uVar22, pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_001b7b2b:
        sVar15 = ZSTD_count((BYTE *)(uVar36 + (long)plVar23),pBVar27 + uVar36,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001ba438:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001ba495:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar28 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar28)) {
LAB_001ba457:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (plVar1 < plVar23) {
LAB_001ba476:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b7bb9:
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001ba54f:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar28) {
            if (0xffffffffffffffe0 <
                (ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2)))) {
LAB_001ba56e:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            lVar19 = local_b0[3];
            *(long *)(pBVar27 + 0x10) = local_b0[2];
            *(long *)(pBVar27 + 0x18) = lVar19;
            if (0x20 < (long)uVar28) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                uVar11 = puVar5[1];
                pBVar3 = pBVar27 + lVar19 + 0x20;
                *(undefined8 *)pBVar3 = *puVar5;
                *(undefined8 *)(pBVar3 + 8) = uVar11;
                puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                uVar11 = puVar5[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                lVar19 = lVar19 + 0x20;
              } while (pBVar3 + 0x20 < pBVar27 + uVar28);
            }
            goto LAB_001b7bb9;
          }
          seqStore->lit = pBVar27 + uVar28;
        }
        uVar36 = sVar15 + uVar36;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar28;
        psVar34->offBase = UVar32;
        if (uVar36 < 3) {
LAB_001ba419:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar36 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001ba4b4:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar36 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar36);
        local_b0 = plVar23;
        uVar13 = local_c4;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) {
LAB_001ba511:
            __assert_fail("base+current0+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                          ,0x181,
                          "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          pUVar8[(ulong)(*(long *)(pBVar9 + (ulong)UVar38 + 2) * -0x30e44323405a9d00) >>
                 (bVar17 & 0x3f)] = UVar38 + 2;
          pUVar8[(ulong)(*(long *)((long)plVar23 + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
               ((int)plVar23 + -2) - iVar35;
          uVar13 = 0;
          if (local_c4 != 0) {
            for (; (local_b0 = plVar23, uVar13 = local_c4, plVar23 <= plVar4 &&
                   ((int)*plVar23 == *(int *)((long)plVar23 - (ulong)local_c4)));
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)local_c4)),(BYTE *)plVar1);
              pUVar8[(ulong)(*plVar23 * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                   (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar36 = (ulong)local_c4;
              local_c4 = (uint)local_58;
              local_58 = uVar36;
            }
          }
        }
      }
    }
    else {
      bVar17 = 0x20 - cVar12;
      plVar14 = plVar1 + -4;
      local_c4 = uVar13;
LAB_001b9938:
      uVar22 = (uint)local_58;
      plVar39 = (long *)((long)plVar23 + uVar37 + 1);
      if (plVar39 < plVar4) {
        if (0x20 < uVar6) goto LAB_001ba4d3;
        plVar21 = plVar23 + 0x10;
        uVar28 = (ulong)((uint)((int)*plVar23 * -0x61c8864f) >> (bVar17 & 0x1f));
        iVar30 = *(int *)((long)plVar23 + 1);
        uVar13 = pUVar8[uVar28];
        lVar19 = -local_58;
        uVar36 = uVar37;
        plVar20 = (long *)((long)plVar23 + 1);
        plVar18 = (long *)(uVar37 + (long)plVar23);
        while( true ) {
          uVar33 = (ulong)((uint)(iVar30 * -0x61c8864f) >> (bVar17 & 0x1f));
          UVar38 = (int)plVar23 - iVar35;
          iVar30 = *(int *)((long)plVar18 + lVar19);
          pUVar8[uVar28] = UVar38;
          if ((uVar22 != 0) && ((int)*plVar18 == iVar30)) {
            uVar36 = (ulong)(*(char *)((long)plVar18 - 1) == *(char *)((long)plVar18 + lVar19 + -1))
            ;
            plVar23 = (long *)((long)plVar18 - uVar36);
            pBVar27 = (BYTE *)((long)plVar18 + (lVar19 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar8[uVar33] = (int)plVar20 - iVar35;
            UVar32 = 1;
            uVar22 = local_c4;
            goto LAB_001b9b15;
          }
          if ((uVar25 <= uVar13) &&
             (uVar26 = (ulong)uVar13, (int)*plVar23 == *(int *)(pBVar9 + uVar26)))
          goto LAB_001b9ac9;
          uVar13 = pUVar8[uVar33];
          uVar26 = (ulong)uVar13;
          uVar28 = (ulong)((uint)((int)*plVar18 * -0x61c8864f) >> (bVar17 & 0x1f));
          UVar38 = (int)plVar20 - iVar35;
          pUVar8[uVar33] = UVar38;
          if ((uVar25 <= uVar13) && ((int)*plVar20 == *(int *)(pBVar9 + uVar26))) break;
          uVar13 = pUVar8[uVar28];
          plVar16 = (long *)((long)plVar18 + uVar36);
          uVar33 = uVar36;
          if (plVar21 <= plVar16) {
            plVar21 = plVar21 + 0x10;
            uVar33 = uVar36 + 1;
          }
          iVar30 = (int)*plVar39;
          plVar40 = (long *)(uVar36 + (long)plVar39);
          uVar36 = uVar33;
          plVar20 = plVar39;
          plVar23 = plVar18;
          plVar39 = plVar40;
          plVar18 = plVar16;
          if (plVar4 <= plVar40) goto LAB_001b9e51;
        }
        plVar23 = plVar20;
        plVar20 = plVar18;
        uVar33 = uVar28;
        if (uVar36 < 5) {
LAB_001b9ac9:
          pUVar8[uVar33] = (int)plVar20 - iVar35;
        }
        pBVar27 = pBVar9 + uVar26;
        uVar13 = (int)plVar23 - (int)pBVar27;
        local_58 = (ulong)uVar13;
        if (uVar13 == 0) goto LAB_001ba530;
        UVar32 = uVar13 + 3;
        uVar36 = 4;
        for (; ((pBVar2 < pBVar27 && (local_b0 < plVar23)) &&
               (*(BYTE *)((long)plVar23 + -1) == pBVar27[-1]));
            plVar23 = (long *)((long)plVar23 + -1)) {
          pBVar27 = pBVar27 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_001b9b15:
        sVar15 = ZSTD_count((BYTE *)(uVar36 + (long)plVar23),pBVar27 + uVar36,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001ba438;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
        uVar28 = (long)plVar23 - (long)local_b0;
        plVar39 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar39 + uVar28))
        goto LAB_001ba457;
        if (plVar1 < plVar23) goto LAB_001ba476;
        if (plVar14 < plVar23) {
          ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)local_b0,(BYTE *)plVar23,(BYTE *)plVar14);
LAB_001b9ba3:
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba54f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_b0[1];
          *plVar39 = *local_b0;
          plVar39[1] = lVar19;
          pBVar27 = seqStore->lit;
          if (0x10 < uVar28) {
            if ((ulong)((long)(pBVar27 + 0x10) + (-0x10 - (long)(local_b0 + 2))) <
                0xffffffffffffffe1) {
              lVar19 = local_b0[3];
              *(long *)(pBVar27 + 0x10) = local_b0[2];
              *(long *)(pBVar27 + 0x18) = lVar19;
              if (0x20 < (long)uVar28) {
                lVar19 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x20);
                  uVar11 = puVar5[1];
                  pBVar3 = pBVar27 + lVar19 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar5 = (undefined8 *)((long)local_b0 + lVar19 + 0x30);
                  uVar11 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar19 = lVar19 + 0x20;
                } while (pBVar3 + 0x20 < pBVar27 + uVar28);
              }
              goto LAB_001b9ba3;
            }
            goto LAB_001ba56e;
          }
          seqStore->lit = pBVar27 + uVar28;
        }
        uVar36 = sVar15 + uVar36;
        psVar34 = seqStore->sequences;
        psVar34->litLength = (U16)uVar28;
        psVar34->offBase = UVar32;
        if (uVar36 < 3) goto LAB_001ba419;
        if (0xffff < uVar36 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar34->mlBase = (U16)(uVar36 - 3);
        psVar34 = psVar34 + 1;
        seqStore->sequences = psVar34;
        plVar23 = (long *)((long)plVar23 + uVar36);
        local_b0 = plVar23;
        local_c4 = uVar22;
        if (plVar23 <= plVar4) {
          if (pBVar9 + (ulong)UVar38 + 2 <= src) goto LAB_001ba511;
          pUVar8[(uint)(*(int *)(pBVar9 + (ulong)UVar38 + 2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               UVar38 + 2;
          pUVar8[(uint)(*(int *)((long)plVar23 + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)plVar23 + -2) - iVar35;
          local_c4 = 0;
          if (uVar22 != 0) {
            for (; local_b0 = plVar23, local_c4 = uVar22, plVar23 <= plVar4;
                plVar23 = (long *)((long)plVar23 + sVar15 + 4)) {
              lVar19 = *plVar23;
              if ((int)lVar19 != *(int *)((long)plVar23 - (ulong)uVar22)) break;
              uVar36 = (ulong)uVar22;
              sVar15 = ZSTD_count((BYTE *)((long)plVar23 + 4),
                                  (BYTE *)((long)plVar23 + (4 - (ulong)uVar22)),(BYTE *)plVar1);
              pUVar8[(uint)((int)lVar19 * -0x61c8864f) >> (bVar17 & 0x1f)] = (int)plVar23 - iVar35;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar34 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_001ba438;
              if (0x20000 < seqStore->maxNbLit) goto LAB_001ba495;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_001ba457;
              if (plVar1 < plVar23) goto LAB_001ba476;
              if (plVar14 < plVar23) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar23,(BYTE *)plVar23,(BYTE *)plVar14);
              }
              else {
                lVar19 = plVar23[1];
                *plVar39 = *plVar23;
                plVar39[1] = lVar19;
              }
              psVar34 = seqStore->sequences;
              psVar34->litLength = 0;
              psVar34->offBase = 1;
              if (sVar15 + 4 < 3) goto LAB_001ba419;
              if (0xffff < sVar15 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ba4b4;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar34 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar34->mlBase = (U16)(sVar15 + 1);
              psVar34 = psVar34 + 1;
              seqStore->sequences = psVar34;
              uVar22 = (uint)local_58;
              local_58 = uVar36;
            }
          }
        }
        goto LAB_001b9938;
      }
    }
LAB_001b9e51:
    if (uVar24 <= uVar31) {
      uVar24 = 0;
    }
    uVar13 = uVar24;
    if (uVar22 != 0) {
      uVar13 = uVar7;
    }
    if (uVar7 <= uVar31) {
      uVar13 = uVar24;
      uVar7 = 0;
    }
    if (uVar22 != 0) {
      uVar7 = uVar22;
    }
    *rep = uVar7;
  }
  if (local_c4 != 0) {
    uVar13 = local_c4;
  }
  rep[1] = uVar13;
  return (long)src + (srcSize - (long)local_b0);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}